

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O2

int i2cWriteBlockData(uint handle,uint reg,char *buf,uint count)

{
  ulong uVar1;
  int iVar2;
  char *pcVar3;
  FILE *pFVar4;
  my_smbus_data data;
  
  pFVar4 = _stderr;
  uVar1 = (ulong)count;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    myBuf2Str(count,buf);
    fprintf(pFVar4,"%s %s: handle=%d reg=%d count=%d [%s]\n",myTimeStamp::buf,"i2cWriteBlockData",
            (ulong)handle,reg,uVar1,myBuf2Str::str);
  }
  pFVar4 = _stderr;
  if (libInitialised == '\0') {
    iVar2 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) != 0) {
      return -0x1f;
    }
    myTimeStamp();
    pcVar3 = "%s %s: pigpio uninitialised, call gpioInitialise()\n";
LAB_001097aa:
    fprintf(pFVar4,pcVar3,myTimeStamp::buf,"i2cWriteBlockData");
  }
  else {
    if ((handle < 0x40) && (i2cInfo[handle].state == 2)) {
      if ((i2cInfo[handle].funcs & 0x2000000) == 0) {
        iVar2 = -0x6b;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x6b;
        }
        myTimeStamp();
        pcVar3 = "%s %s: SMBUS command not supported by driver\n";
        goto LAB_001097aa;
      }
      if (reg < 0x100) {
        if (count - 0x21 < 0xffffffe0) {
          iVar2 = -0x51;
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x51;
          }
          myTimeStamp();
          pcVar3 = "%s %s: bad count (%d)\n";
          goto LAB_001098fb;
        }
        for (uVar1 = 1; count + 1 != uVar1; uVar1 = uVar1 + 1) {
          data.block[uVar1] = buf[uVar1 - 1];
        }
        data.byte = (uint8_t)count;
        reg = my_smbus_access((int)i2cInfo[handle].fd,'\0',(uint8_t)reg,5,&data);
        pFVar4 = _stderr;
        if (-1 < (int)reg) {
          return reg;
        }
        iVar2 = -0x52;
        if (gpioCfg.dbgLevel < 4) {
          return -0x52;
        }
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x52;
        }
        myTimeStamp();
        pcVar3 = "%s %s: error=%d (%m)\n";
      }
      else {
        iVar2 = -0x51;
        if ((gpioCfg.internals >> 10 & 1) != 0) {
          return -0x51;
        }
        myTimeStamp();
        pcVar3 = "%s %s: bad reg (%d)\n";
      }
      uVar1 = (ulong)reg;
    }
    else {
      iVar2 = -0x19;
      if ((gpioCfg.internals >> 10 & 1) != 0) {
        return -0x19;
      }
      myTimeStamp();
      pcVar3 = "%s %s: bad handle (%d)\n";
      uVar1 = (ulong)handle;
    }
LAB_001098fb:
    fprintf(pFVar4,pcVar3,myTimeStamp::buf,"i2cWriteBlockData",uVar1);
  }
  return iVar2;
}

Assistant:

int i2cWriteBlockData(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   union my_smbus_data data;

   int i, status;

   DBG(DBG_USER, "handle=%d reg=%d count=%d [%s]",
      handle, reg, count, myBuf2Str(count, buf));

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_WRITE_BLOCK_DATA) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (reg > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad reg (%d)", reg);

   if ((count < 1) || (count > 32))
      SOFT_ERROR(PI_BAD_PARAM, "bad count (%d)", count);

   for (i=1; i<=count; i++) data.block[i] = buf[i-1];
   data.block[0] = count;

   status = my_smbus_access(
            i2cInfo[handle].fd,
            PI_I2C_SMBUS_WRITE,
            reg,
            PI_I2C_SMBUS_BLOCK_DATA,
            &data);

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_WRITE_FAILED;
   }

   return status;
}